

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DuplicateImportElimination.cpp
# Opt level: O0

void __thiscall
wasm::DuplicateImportElimination::run(DuplicateImportElimination *this,Module *module)

{
  char *pcVar1;
  bool bVar2;
  pointer *this_00;
  reference ppFVar3;
  pointer ppVar4;
  Function *pFVar5;
  mapped_type *this_01;
  mapped_type *this_02;
  PassRunner *runner;
  reference pNVar6;
  Name name;
  __normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> local_1c0;
  iterator __end3;
  iterator __begin3;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *__range3;
  Function *previousFunc;
  Name previousName;
  _Self local_170;
  _Self local_168;
  iterator iter;
  undefined1 local_150 [8];
  pair<wasm::Name,_wasm::Name> pair;
  Function *func;
  iterator __end2;
  iterator __begin2;
  vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *__range2;
  vector<wasm::Name,_std::allocator<wasm::Name>_> toRemove;
  map<std::pair<wasm::Name,_wasm::Name>,_wasm::Name,_std::less<std::pair<wasm::Name,_wasm::Name>_>,_std::allocator<std::pair<const_std::pair<wasm::Name,_wasm::Name>,_wasm::Name>_>_>
  seen;
  map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  replacements;
  ImportInfo imports;
  Module *module_local;
  DuplicateImportElimination *this_local;
  
  imports.importedTags.super__Vector_base<wasm::Tag_*,_std::allocator<wasm::Tag_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)module;
  ImportInfo::ImportInfo
            ((ImportInfo *)&replacements._M_t._M_impl.super__Rb_tree_header._M_node_count,module);
  std::
  map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  ::map((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
         *)&seen._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<std::pair<wasm::Name,_wasm::Name>,_wasm::Name,_std::less<std::pair<wasm::Name,_wasm::Name>_>,_std::allocator<std::pair<const_std::pair<wasm::Name,_wasm::Name>,_wasm::Name>_>_>
  ::map((map<std::pair<wasm::Name,_wasm::Name>,_wasm::Name,_std::less<std::pair<wasm::Name,_wasm::Name>_>,_std::allocator<std::pair<const_std::pair<wasm::Name,_wasm::Name>,_wasm::Name>_>_>
         *)&toRemove.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage);
  std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector
            ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&__range2);
  this_00 = &imports.importedGlobals.
             super__Vector_base<wasm::Global_*,_std::allocator<wasm::Global_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  __end2 = std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::begin
                     ((vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)this_00);
  func = (Function *)
         std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::end
                   ((vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)this_00);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<wasm::Function_**,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
                                *)&func);
    if (!bVar2) {
      bVar2 = std::
              map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
              ::empty((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                       *)&seen._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if (!bVar2) {
        Module::updateMaps((Module *)
                           imports.importedTags.
                           super__Vector_base<wasm::Tag_*,_std::allocator<wasm::Tag_*>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
        runner = Pass::getPassRunner(&this->super_Pass);
        OptUtils::replaceFunctions
                  (runner,(Module *)
                          imports.importedTags.
                          super__Vector_base<wasm::Tag_*,_std::allocator<wasm::Tag_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,
                   (map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                    *)&seen._M_t._M_impl.super__Rb_tree_header._M_node_count);
        __end3 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::begin
                           ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&__range2);
        local_1c0._M_current =
             (Name *)std::vector<wasm::Name,_std::allocator<wasm::Name>_>::end
                               ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&__range2);
        while (bVar2 = __gnu_cxx::operator!=(&__end3,&local_1c0), bVar2) {
          pNVar6 = __gnu_cxx::
                   __normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                   ::operator*(&__end3);
          Module::removeFunction
                    ((Module *)
                     imports.importedTags.
                     super__Vector_base<wasm::Tag_*,_std::allocator<wasm::Tag_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,(Name)(pNVar6->super_IString).str);
          __gnu_cxx::
          __normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::
          operator++(&__end3);
        }
      }
      std::vector<wasm::Name,_std::allocator<wasm::Name>_>::~vector
                ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&__range2);
      std::
      map<std::pair<wasm::Name,_wasm::Name>,_wasm::Name,_std::less<std::pair<wasm::Name,_wasm::Name>_>,_std::allocator<std::pair<const_std::pair<wasm::Name,_wasm::Name>,_wasm::Name>_>_>
      ::~map((map<std::pair<wasm::Name,_wasm::Name>,_wasm::Name,_std::less<std::pair<wasm::Name,_wasm::Name>_>,_std::allocator<std::pair<const_std::pair<wasm::Name,_wasm::Name>,_wasm::Name>_>_>
              *)&toRemove.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
      std::
      map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
      ::~map((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
              *)&seen._M_t._M_impl.super__Rb_tree_header._M_node_count);
      ImportInfo::~ImportInfo
                ((ImportInfo *)&replacements._M_t._M_impl.super__Rb_tree_header._M_node_count);
      return;
    }
    ppFVar3 = __gnu_cxx::
              __normal_iterator<wasm::Function_**,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
              ::operator*(&__end2);
    pair.second.super_IString.str._M_str = (char *)*ppFVar3;
    std::pair<wasm::Name,_wasm::Name>::pair<wasm::Name_&,_wasm::Name_&,_true>
              ((pair<wasm::Name,_wasm::Name> *)local_150,
               &(((Function *)pair.second.super_IString.str._M_str)->super_Importable).module,
               &(((Function *)pair.second.super_IString.str._M_str)->super_Importable).base);
    local_168._M_node =
         (_Base_ptr)
         std::
         map<std::pair<wasm::Name,_wasm::Name>,_wasm::Name,_std::less<std::pair<wasm::Name,_wasm::Name>_>,_std::allocator<std::pair<const_std::pair<wasm::Name,_wasm::Name>,_wasm::Name>_>_>
         ::find((map<std::pair<wasm::Name,_wasm::Name>,_wasm::Name,_std::less<std::pair<wasm::Name,_wasm::Name>_>,_std::allocator<std::pair<const_std::pair<wasm::Name,_wasm::Name>,_wasm::Name>_>_>
                 *)&toRemove.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,(key_type *)local_150);
    local_170._M_node =
         (_Base_ptr)
         std::
         map<std::pair<wasm::Name,_wasm::Name>,_wasm::Name,_std::less<std::pair<wasm::Name,_wasm::Name>_>,_std::allocator<std::pair<const_std::pair<wasm::Name,_wasm::Name>,_wasm::Name>_>_>
         ::end((map<std::pair<wasm::Name,_wasm::Name>,_wasm::Name,_std::less<std::pair<wasm::Name,_wasm::Name>_>,_std::allocator<std::pair<const_std::pair<wasm::Name,_wasm::Name>,_wasm::Name>_>_>
                *)&toRemove.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
    bVar2 = std::operator!=(&local_168,&local_170);
    if (bVar2) {
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_std::pair<wasm::Name,_wasm::Name>,_wasm::Name>_>::
               operator->(&local_168);
      previousFunc = (Function *)(ppVar4->second).super_IString.str._M_len;
      previousName.super_IString.str._M_len = (size_t)(ppVar4->second).super_IString.str._M_str;
      pFVar5 = Module::getFunction((Module *)
                                   imports.importedTags.
                                   super__Vector_base<wasm::Tag_*,_std::allocator<wasm::Tag_*>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage,
                                   (Name)(ppVar4->second).super_IString.str);
      bVar2 = HeapType::operator==
                        (&pFVar5->type,(HeapType *)(pair.second.super_IString.str._M_str + 0x38));
      if (!bVar2) goto LAB_01c2206e;
      this_01 = std::
                map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                ::operator[]((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                              *)&seen._M_t._M_impl.super__Rb_tree_header._M_node_count,
                             (key_type *)pair.second.super_IString.str._M_str);
      wasm::Name::operator=(this_01,(Name *)&previousFunc);
      std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
                ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&__range2,
                 (value_type *)pair.second.super_IString.str._M_str);
    }
    else {
LAB_01c2206e:
      pcVar1 = pair.second.super_IString.str._M_str;
      this_02 = std::
                map<std::pair<wasm::Name,_wasm::Name>,_wasm::Name,_std::less<std::pair<wasm::Name,_wasm::Name>_>,_std::allocator<std::pair<const_std::pair<wasm::Name,_wasm::Name>,_wasm::Name>_>_>
                ::operator[]((map<std::pair<wasm::Name,_wasm::Name>,_wasm::Name,_std::less<std::pair<wasm::Name,_wasm::Name>_>,_std::allocator<std::pair<const_std::pair<wasm::Name,_wasm::Name>,_wasm::Name>_>_>
                              *)&toRemove.
                                 super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl
                                 .super__Vector_impl_data._M_end_of_storage,(key_type *)local_150);
      wasm::Name::operator=(this_02,(Name *)pcVar1);
    }
    __gnu_cxx::
    __normal_iterator<wasm::Function_**,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

void run(Module* module) override {
    ImportInfo imports(*module);
    std::map<Name, Name> replacements;
    std::map<std::pair<Name, Name>, Name> seen;
    std::vector<Name> toRemove;
    for (auto* func : imports.importedFunctions) {
      auto pair = std::pair{func->module, func->base};
      auto iter = seen.find(pair);
      if (iter != seen.end()) {
        auto previousName = iter->second;
        auto previousFunc = module->getFunction(previousName);
        // It is ok to import the same thing with multiple types; we can only
        // merge if the types match, of course.
        if (previousFunc->type == func->type) {
          replacements[func->name] = previousName;
          toRemove.push_back(func->name);
          continue;
        }
      }
      seen[pair] = func->name;
    }
    if (!replacements.empty()) {
      module->updateMaps();
      OptUtils::replaceFunctions(getPassRunner(), *module, replacements);
      for (auto name : toRemove) {
        module->removeFunction(name);
      }
    }
  }